

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepSetTables(void *arkode_mem,int q,int p,ARKodeButcherTable Bi,ARKodeButcherTable Be)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  int error_code;
  char *pcVar3;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw;
  sunindextype Bliw;
  ARKodeMem local_48;
  ARKodeARKStepMem local_40;
  int local_38;
  int local_34;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetTables",&local_48,&local_40);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (Bi == (ARKodeButcherTable)0x0 && Be == (ARKodeButcherTable)0x0) {
    pcVar3 = "At least one complete table must be supplied";
LAB_004becac:
    arkProcessError(local_48,-0x15,"ARKode::ARKStep","ARKStepSetTables",pcVar3);
    return -0x16;
  }
  if ((Be != (ARKodeButcherTable)0x0 && Bi != (ARKodeButcherTable)0x0) && (Bi->stages != Be->stages)
     ) {
    pcVar3 = "Both tables must have the same number of stages";
    goto LAB_004becac;
  }
  local_40->stages = 0;
  local_40->q = 0;
  local_40->p = 0;
  ARKodeButcherTable_Space(local_40->Be,&local_34,&local_38);
  ARKodeButcherTable_Free(local_40->Be);
  local_40->Be = (ARKodeButcherTable)0x0;
  local_48->liw = local_48->liw - (long)local_34;
  local_48->lrw = local_48->lrw - (long)local_38;
  ARKodeButcherTable_Space(local_40->Bi,&local_34,&local_38);
  ARKodeButcherTable_Free(local_40->Bi);
  local_40->Bi = (ARKodeButcherTable)0x0;
  local_48->liw = local_48->liw - (long)local_34;
  local_48->lrw = local_48->lrw - (long)local_38;
  if (Bi == (ARKodeButcherTable)0x0) {
    local_40->stages = Be->stages;
    iVar1 = Be->p;
    local_40->q = Be->q;
    local_40->p = iVar1;
    pAVar2 = ARKodeButcherTable_Copy(Be);
    local_40->Be = pAVar2;
    if (pAVar2 != (ARKodeButcherTable)0x0) {
      iVar1 = ARKStepSetExplicit(arkode_mem);
      if (iVar1 == 0) {
LAB_004beeee:
        ARKodeButcherTable_Space(local_40->Be,&local_34,&local_38);
        local_48->liw = local_48->liw + (long)local_34;
        local_48->lrw = local_48->lrw + (long)local_38;
        ARKodeButcherTable_Space(local_40->Bi,&local_34,&local_38);
        local_48->liw = local_48->liw + (long)local_34;
        local_48->lrw = local_48->lrw + (long)local_38;
        return 0;
      }
      pcVar3 = "Error in ARKStepSetExplicit";
LAB_004beebb:
      error_code = -0x16;
      goto LAB_004beee5;
    }
  }
  else {
    local_40->stages = Bi->stages;
    if (Be == (ARKodeButcherTable)0x0) {
      iVar1 = Bi->p;
      local_40->q = Bi->q;
      local_40->p = iVar1;
      pAVar2 = ARKodeButcherTable_Copy(Bi);
      local_40->Bi = pAVar2;
      if (pAVar2 != (ARKodeButcherTable)0x0) {
        iVar1 = ARKStepSetImplicit(arkode_mem);
        if (iVar1 == 0) goto LAB_004beeee;
        pcVar3 = "Error in ARKStepSetImplicit";
LAB_004beeb6:
        iVar1 = -0x16;
        goto LAB_004beebb;
      }
    }
    else {
      local_40->q = q;
      local_40->p = p;
      pAVar2 = ARKodeButcherTable_Copy(Be);
      local_40->Be = pAVar2;
      if (pAVar2 != (ARKodeButcherTable)0x0) {
        pAVar2 = ARKodeButcherTable_Copy(Bi);
        local_40->Bi = pAVar2;
        if (pAVar2 != (ARKodeButcherTable)0x0) {
          iVar1 = ARKStepSetImEx(arkode_mem);
          if (iVar1 == 0) goto LAB_004beeee;
          pcVar3 = "Error in ARKStepSetImEx";
          goto LAB_004beeb6;
        }
      }
    }
  }
  pcVar3 = "arkode_mem = NULL illegal.";
  iVar1 = -0x15;
  error_code = -0x15;
LAB_004beee5:
  arkProcessError(local_48,error_code,"ARKode::ARKStep","ARKStepSetTables",pcVar3);
  return iVar1;
}

Assistant:

int ARKStepSetTables(void *arkode_mem, int q, int p,
                     ARKodeButcherTable Bi, ARKodeButcherTable Be)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetTables",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for illegal inputs */
  if ((Bi == NULL) && (Be == NULL)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetTables",
                    "At least one complete table must be supplied");
    return(ARK_ILL_INPUT);
  }

  /* if both tables are set, check that they have the same number of stages */
  if ((Bi != NULL) && (Be != NULL)) {
    if (Bi->stages != Be->stages) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Both tables must have the same number of stages");
      return(ARK_ILL_INPUT);
    }
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /*
   * determine mode (implicit/explicit/ImEx), and perform appropriate actions
   */

  /* explicit */
  if (Bi == NULL) {

    /* set the relevant parameters (use table q and p) */
    step_mem->stages = Be->stages;
    step_mem->q = Be->q;
    step_mem->p = Be->p;

    /* copy the table in step memory */
    step_mem->Be = ARKodeButcherTable_Copy(Be);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as purely explicit */
    retval = ARKStepSetExplicit(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetExplicit");
      return(retval);
    }

  /* implicit */
  } else if (Be == NULL) {

    /* set the relevant parameters (use table q and p) */
    step_mem->stages = Bi->stages;
    step_mem->q = Bi->q;
    step_mem->p = Bi->p;

    /* copy the table in step memory */
    step_mem->Bi = ARKodeButcherTable_Copy(Bi);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as purely implicit */
    retval = ARKStepSetImplicit(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetImplicit");
      return(ARK_ILL_INPUT);
    }

  /* ImEx */
  } else {

    /* set the relevant parameters (use input q and p) */
    step_mem->stages = Bi->stages;
    step_mem->q = q;
    step_mem->p = p;

    /* copy the explicit table into step memory */
    step_mem->Be = ARKodeButcherTable_Copy(Be);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* copy the implicit table into step memory */
    step_mem->Bi = ARKodeButcherTable_Copy(Bi);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as ImEx */
    retval = ARKStepSetImEx(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetImEx");
      return(ARK_ILL_INPUT);
    }
  }

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return(ARK_SUCCESS);
}